

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HFactorDebug.cpp
# Opt level: O2

void debugPivotValueAnalysis
               (HighsInt highs_debug_level,HighsLogOptions *log_options,HighsInt num_row,
               vector<double,_std::allocator<double>_> *u_pivot_value)

{
  ulong uVar1;
  ulong uVar2;
  double dVar3;
  double dVar4;
  double local_48;
  double local_40;
  
  if (0 < highs_debug_level) {
    uVar1 = 0;
    uVar2 = 0;
    if (0 < num_row) {
      uVar2 = (ulong)(uint)num_row;
    }
    local_40 = INFINITY;
    local_48 = 0.0;
    dVar4 = 0.0;
    for (; uVar2 != uVar1; uVar1 = uVar1 + 1) {
      dVar3 = ABS((u_pivot_value->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                  super__Vector_impl_data._M_start[uVar1]);
      if (dVar3 <= local_40) {
        local_40 = dVar3;
      }
      if (local_48 <= dVar3) {
        local_48 = dVar3;
      }
      dVar3 = log(dVar3);
      dVar4 = dVar4 + dVar3;
    }
    dVar4 = exp(dVar4 / (double)num_row);
    if ((highs_debug_level != 1) || (local_40 < 1e-08)) {
      highsLogDev(log_options,kError,"InvertPivotAnalysis: %d pivots: Min %g; Mean %g; Max %g\n",
                  local_40,dVar4,local_48,(ulong)(uint)num_row);
      return;
    }
  }
  return;
}

Assistant:

void debugPivotValueAnalysis(const HighsInt highs_debug_level,
                             const HighsLogOptions& log_options,
                             const HighsInt num_row,
                             const vector<double>& u_pivot_value) {
  if (highs_debug_level < kHighsDebugLevelCheap) return;
  double min_pivot = kHighsInf;
  double mean_pivot = 0;
  double max_pivot = 0;
  for (HighsInt iRow = 0; iRow < num_row; iRow++) {
    double abs_pivot = fabs(u_pivot_value[iRow]);
    min_pivot = min(abs_pivot, min_pivot);
    max_pivot = max(abs_pivot, max_pivot);
    mean_pivot += log(abs_pivot);
  }
  mean_pivot = exp(mean_pivot / num_row);
  if (highs_debug_level > kHighsDebugLevelCheap || min_pivot < 1e-8)
    highsLogDev(log_options, HighsLogType::kError,
                "InvertPivotAnalysis: %" HIGHSINT_FORMAT
                " pivots: Min %g; Mean "
                "%g; Max %g\n",
                num_row, min_pivot, mean_pivot, max_pivot);
}